

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenConViol(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                   *cvmap,MemoryWriter *wrt,int alg_log)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>
  *cva;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *in_stack_fffffffffffffdd8;
  const_reference in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  string *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string local_188 [7];
  undefined1 in_stack_fffffffffffffe7f;
  MemoryWriter *in_stack_fffffffffffffe80;
  ViolSummary *in_stack_fffffffffffffe88;
  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffe90;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [38];
  byte local_c2;
  byte local_c1;
  string local_c0 [32];
  string local_a0 [38];
  byte local_7a;
  undefined1 local_79 [3];
  byte local_76;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  string local_60 [32];
  reference local_40;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                  *)0x1729c3);
  if (sVar3 != 0) {
    local_28 = local_10;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
         ::begin(in_stack_fffffffffffffdd8);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
         ::end(in_stack_fffffffffffffdd8);
    while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
      local_40 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>
                              *)in_stack_fffffffffffffde0);
      std::array<mp::ViolSummary,_3UL>::at
                ((array<mp::ViolSummary,_3UL> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (size_type)in_stack_fffffffffffffde8);
      iVar2 = std::__cxx11::string::compare((ulong)local_40,0,(char *)0x8);
      local_75[0x13] = (allocator<char>)0x0;
      local_76 = 0;
      local_79[1] = 0;
      local_7a = 0;
      local_c1 = 0;
      local_c2 = 0;
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        local_75[0x13] = (allocator<char>)0x1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10))
        ;
      }
      else {
        iVar2 = std::__cxx11::string::compare((ulong)local_40,0,(char *)0x4);
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          local_76 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
        }
        else {
          iVar2 = std::__cxx11::string::compare((ulong)local_40,0,(char *)0x9);
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            local_79[1] = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
          }
          else {
            iVar2 = std::__cxx11::string::compare((ulong)local_40,0,(char *)0x5);
            if (iVar2 == 0) {
              in_stack_fffffffffffffe20 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
              std::allocator<char>::allocator();
              local_7a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                         (allocator<char> *)
                         CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
            }
            else {
              std::__cxx11::string::string(local_c0,(string *)local_40);
              local_c1 = 1;
              std::operator+((char *)in_stack_fffffffffffffde8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffde0);
              local_c2 = 1;
              std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
            }
          }
        }
      }
      Gen1Viol(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (bool)in_stack_fffffffffffffe7f,in_RDI);
      std::__cxx11::string::~string(local_60);
      if ((local_c2 & 1) != 0) {
        std::__cxx11::string::~string(local_a0);
      }
      if ((local_c1 & 1) != 0) {
        std::__cxx11::string::~string(local_c0);
      }
      if ((local_7a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_79);
      }
      if ((local_79[1] & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(local_79 + 2));
      }
      if ((local_76 & 1) != 0) {
        std::allocator<char>::~allocator(local_75);
      }
      if (((byte)local_75[0x13] & 1) != 0) {
        std::allocator<char>::~allocator(&local_61);
      }
      std::array<mp::ViolSummary,_3UL>::at
                ((array<mp::ViolSummary,_3UL> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (size_type)in_stack_fffffffffffffde8);
      in_stack_fffffffffffffe17 = local_1c == 0;
      in_stack_fffffffffffffe18 = local_128;
      std::__cxx11::string::string(in_stack_fffffffffffffe18,(string *)local_40);
      std::operator+((char *)in_stack_fffffffffffffde8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
      std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      Gen1Viol(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (bool)in_stack_fffffffffffffe7f,in_RDI);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      in_stack_fffffffffffffde0 =
           std::array<mp::ViolSummary,_3UL>::at
                     ((array<mp::ViolSummary,_3UL> *)
                      CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                      (size_type)in_stack_fffffffffffffde8);
      in_stack_fffffffffffffdf7 = local_1c == 0;
      in_stack_fffffffffffffde8 = local_18;
      std::__cxx11::string::string(local_188,(string *)local_40);
      std::operator+((char *)in_stack_fffffffffffffde8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde0);
      std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      Gen1Viol(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (bool)in_stack_fffffffffffffe7f,in_RDI);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_188);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>
                    *)in_stack_fffffffffffffde0);
    }
  }
  return;
}

Assistant:

void GenConViol(
      const std::map< std::string, ViolSummArray<3> >& cvmap,
      fmt::MemoryWriter& wrt, int alg_log) {
    if (cvmap.size()) {
      for (const auto& cva: cvmap) {
        Gen1Viol(cva.second.at(0), wrt, !alg_log,
                 0==cva.first.compare(0, 8, "_linfunc")
                 ? "aux algebr con(s)"
                 : 0==cva.first.compare(0, 4, "_lin")
                   ? "algebraic con(s)"
                 : 0==cva.first.compare(0, 9, "_quadfunc")
                   ? "aux quadr con(s)"
                 : 0==cva.first.compare(0, 5, "_quad")
                   ? "quadratic con(s)"
                 : "expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(1), wrt, !alg_log,
                 "interm expr '"
                 + std::string(cva.first) + "'");
        Gen1Viol(cva.second.at(2), wrt, !alg_log,
                 "final expr '"
                 + std::string(cva.first) + "'");
      }
    }
  }